

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cf95::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody
          (ArenaTest_FuzzFuseFreeAllocatorRace_Test *this)

{
  undefined8 *puVar1;
  pointer ptVar2;
  pointer __last;
  upb_Arena *puVar3;
  size_type __n;
  pointer __result;
  thread *ptVar4;
  code *__args;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_00;
  anon_class_24_3_d913d062_for__M_head_impl *__args_00;
  anon_class_24_3_d913d062_for__M_head_impl *extraout_RDX_01;
  size_t i;
  long lVar5;
  pointer ptVar6;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  size_t j;
  long lVar7;
  ulong uVar8;
  Time TVar9;
  Time TVar10;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Notification done;
  vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_> arenas;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_upb_mem_arena_test_cc:512:40)>
  reset_max_block_size;
  array<upb_Arena_*,_11UL> arr;
  
  upb_Arena_SetMaxBlockSize(0x80);
  reset_max_block_size.storage_.callback_buffer_ = (char  [8])upb_alloc_global;
  __args = checking_global_allocfunc;
  upb_alloc_global.func = checking_global_allocfunc;
  done.mutex_.mu_.super___atomic_base<long>._M_i = (atomic<long>)(__atomic_base<long>)0x0;
  reset_max_block_size.storage_.is_callback_engaged_ = true;
  done.notified_yet_._M_base._M_i = (__atomic_base<bool>)false;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arenas.
  super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arenas.
  super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arenas.
  super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar5 = 0; lVar5 != 10000; lVar5 = lVar5 + 1) {
    arr._M_elems[0] = upb_Arena_New();
    for (lVar7 = 1; lVar7 != 0xb; lVar7 = lVar7 + 1) {
      puVar3 = upb_Arena_New();
      arr._M_elems[lVar7] = puVar3;
      upb_Arena_Fuse(*(upb_Arena **)(reset_max_block_size.storage_.callback_buffer_ + lVar7 * 8),
                     puVar3);
    }
    std::vector<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>::
    push_back(&arenas,&arr);
    __args = (code *)extraout_RDX;
  }
  puVar3 = (upb_Arena *)0x0;
  while( true ) {
    ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar3 == (upb_Arena *)0xa) break;
    arr._M_elems[0] = puVar3;
    arr._M_elems[1] = (upb_Arena *)&done;
    arr._M_elems[2] = (upb_Arena *)&arenas;
    if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                      (&threads,1,"vector::_M_realloc_insert");
      __last = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      __result = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            __n);
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
                ((allocator_type *)(((long)ptVar2 - (long)ptVar6) + (long)__result),(thread *)&arr,
                 __args_00);
      ptVar4 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar6,ptVar2,__result,(allocator<std::thread> *)&threads);
      ptVar4 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                         (ptVar2,__last,ptVar4 + 1,(allocator<std::thread> *)&threads);
      std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,ptVar6,
                 (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage - (long)ptVar6 >> 3);
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + __n;
      __args = (code *)extraout_RDX_01;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = ptVar4;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::
      construct<std::thread,(anonymous_namespace)::ArenaTest_FuzzFuseFreeAllocatorRace_Test::TestBody()::__1>
                ((allocator_type *)
                 threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish,(thread *)&arr,
                 (anon_class_24_3_d913d062_for__M_head_impl *)__args);
      __args = (code *)extraout_RDX_00;
      threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    puVar3 = (upb_Arena *)((long)&puVar3->ptr_dont_copy_me__upb_internal_use_only + 1);
  }
  TVar9 = absl::lts_20250127::Now();
  TVar9 = absl::lts_20250127::operator+(TVar9,(Duration)ZEXT812(2));
  lVar5 = 0x50;
  uVar8 = 0xffffffffffffffff;
  do {
    TVar10 = absl::lts_20250127::Now();
    if (TVar10.rep_.rep_hi_ == TVar9.rep_.rep_hi_) {
      if (TVar9.rep_.rep_lo_ <= TVar10.rep_.rep_lo_) goto LAB_00148163;
    }
    else if ((long)TVar9.rep_.rep_hi_ <= (long)TVar10.rep_.rep_hi_) {
LAB_00148163:
      absl::lts_20250127::Notification::Notify(&done);
      while (ptVar2 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish, uVar8 = uVar8 + 1,
            ptVar6 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar8 < (ulong)(((long)arenas.
                                   super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)arenas.
                                  super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x58)) {
        puVar1 = (undefined8 *)
                 ((long)(arenas.
                         super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5);
        lVar5 = lVar5 + 0x58;
        upb_Arena_Free((upb_Arena *)*puVar1);
      }
      for (; ptVar6 != ptVar2; ptVar6 = ptVar6 + 1) {
        std::thread::join();
      }
      std::
      _Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>::
      ~_Vector_base(&arenas.
                     super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                   );
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
      absl::lts_20250127::Notification::~Notification(&done);
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc:512:40)>
      ::~Cleanup(&reset_max_block_size);
      return;
    }
    if ((ulong)(((long)arenas.
                       super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)arenas.
                      super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x58) <= uVar8 + 1)
    goto LAB_00148163;
    puVar3 = *(upb_Arena **)
              ((long)(arenas.
                      super__Vector_base<std::array<upb_Arena_*,_11UL>,_std::allocator<std::array<upb_Arena_*,_11UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5);
    ::upb_Arena_Malloc(puVar3,0x80);
    ::upb_Arena_Malloc(puVar3,0x80);
    lVar5 = lVar5 + 0x58;
    upb_Arena_Free(puVar3);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

TEST(ArenaTest, FuzzFuseFreeAllocatorRace) {
  upb_Arena_SetMaxBlockSize(128);
  upb_alloc_func* old = upb_alloc_global.func;
  upb_alloc_global.func = checking_global_allocfunc;
  absl::Cleanup reset_max_block_size = [old] {
    upb_Arena_SetMaxBlockSize(UPB_PRIVATE(kUpbDefaultMaxBlockSize));
    upb_alloc_global.func = old;
  };
  absl::Notification done;
  std::vector<std::thread> threads;
  size_t thread_count = 10;
  std::vector<std::array<upb_Arena*, 11>> arenas;
  for (size_t i = 0; i < 10000; ++i) {
    std::array<upb_Arena*, 11> arr;
    arr[0] = upb_Arena_New();
    for (size_t j = 1; j < thread_count + 1; ++j) {
      arr[j] = upb_Arena_New();
      upb_Arena_Fuse(arr[j - 1], arr[j]);
    }
    arenas.push_back(arr);
  }
  for (size_t i = 0; i < thread_count; ++i) {
    size_t tid = i;
    threads.emplace_back([&, tid]() {
      size_t arenaCtr = 0;
      while (!done.HasBeenNotified() && arenaCtr < arenas.size()) {
        upb_Arena* read = arenas[arenaCtr++][tid];
        (void)upb_Arena_Malloc(read, 128);
        (void)upb_Arena_Malloc(read, 128);
        upb_Arena_Free(read);
      }
      while (arenaCtr < arenas.size()) {
        upb_Arena_Free(arenas[arenaCtr++][tid]);
      }
    });
  }
  auto end = absl::Now() + absl::Seconds(2);
  size_t arenaCtr = 0;
  while (absl::Now() < end && arenaCtr < arenas.size()) {
    upb_Arena* read = arenas[arenaCtr++][thread_count];
    (void)upb_Arena_Malloc(read, 128);
    (void)upb_Arena_Malloc(read, 128);
    upb_Arena_Free(read);
  }
  done.Notify();
  while (arenaCtr < arenas.size()) {
    upb_Arena_Free(arenas[arenaCtr++][thread_count]);
  }
  for (auto& t : threads) t.join();
}